

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

bool __thiscall c4::yml::Parser::_handle_types(Parser *this)

{
  Tree *this_00;
  code *pcVar1;
  Location LVar2;
  undefined1 auVar3 [24];
  Location LVar4;
  Location LVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  bool bVar9;
  undefined1 uVar10;
  bool bVar11;
  YamlTag_e YVar12;
  int iVar13;
  size_t sVar14;
  size_t sVar15;
  yml *pyVar16;
  uint uVar17;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong uVar18;
  void *pvVar19;
  ulong extraout_RDX_01;
  State *pSVar20;
  pfn_error p_Var21;
  csubstr cVar22;
  ro_substr pattern;
  ro_substr chars;
  ro_substr pattern_00;
  ro_substr pattern_01;
  ro_substr chars_00;
  ro_substr pattern_02;
  csubstr fmt;
  ro_substr chars_01;
  csubstr tag;
  ro_substr pattern_03;
  ro_substr chars_02;
  basic_substring<const_char> local_1f8;
  basic_substring<const_char> local_1e8;
  char msg [27];
  uint uStack_188;
  undefined4 uStack_178;
  undefined4 uStack_174;
  size_t local_170;
  uint uStack_160;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  size_t local_148;
  size_t local_120;
  size_t local_f8;
  size_t local_d0;
  uint uStack_c0;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  size_t local_a8;
  uint uStack_98;
  undefined4 uStack_88;
  undefined4 uStack_84;
  size_t local_80;
  uint uStack_70;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  size_t local_58;
  size_t local_30;
  
  local_1f8 = basic_substring<const_char>::triml(&(this->m_state->line_contents).rem,' ');
  local_1e8.str = (char *)0x0;
  local_1e8.len = 0;
  pattern.len = 2;
  pattern.str = "!!";
  bVar9 = basic_substring<const_char>::begins_with(&local_1f8,pattern);
  if (bVar9) {
    chars.len = 2;
    chars.str = " ,";
    sVar14 = basic_substring<const_char>::first_of(&local_1f8,chars,0);
    if ((sVar14 != 0xffffffffffffffff) && (local_1f8.len < sVar14)) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
        pcVar1 = (code *)swi(3);
        uVar10 = (*pcVar1)();
        return (bool)uVar10;
      }
      handle_error(0x1e5106,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x1569,"pos <= len || pos == npos");
    }
    if (sVar14 == 0xffffffffffffffff) {
      msg._0_8_ = local_1f8.str;
      msg._8_3_ = (undefined3)local_1f8.len;
      msg._11_3_ = local_1f8.len._3_3_;
      msg._14_2_ = local_1f8.len._6_2_;
    }
    else {
      basic_substring<const_char>::basic_substring
                ((basic_substring<const_char> *)msg,local_1f8.str,sVar14);
    }
    local_1e8.len = CONCAT26(msg._14_2_,CONCAT33(msg._11_3_,msg._8_3_));
    local_1e8.str = (char *)msg._0_8_;
    if (local_1e8.len < (char *)0x2) {
      builtin_strncpy(msg + 0x10,".len >= 2)",0xb);
      builtin_strncpy(msg,"check failed: (t",0x10);
      if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
        pcVar1 = (code *)swi(3);
        uVar10 = (*pcVar1)();
        return (bool)uVar10;
      }
      p_Var21 = (this->m_stack).m_callbacks.m_error;
      cVar22 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_30 = cVar22.len;
      auVar3 = ZEXT1224(ZEXT412(0x722a) << 0x40);
      LVar2.name.str._0_4_ = (int)cVar22.str;
      LVar2.super_LineCol.offset = auVar3._0_8_;
      LVar2.super_LineCol.line = auVar3._8_8_;
      LVar2.super_LineCol.col = auVar3._16_8_;
      LVar2.name.str._4_4_ = cVar22.str._4_4_;
      LVar2.name.len = local_30;
      (*p_Var21)(msg,0x1b,LVar2,(this->m_stack).m_callbacks.m_user_data);
    }
    iVar13 = basic_substring<const_char>::compare(&local_1e8,"!!set",5);
    if (iVar13 == 0) {
      this->m_state->flags = this->m_state->flags | 0x800;
    }
  }
  else {
    pattern_00.len = 2;
    pattern_00.str = "!<";
    bVar9 = basic_substring<const_char>::begins_with(&local_1f8,pattern_00);
    if (bVar9) {
      sVar14 = basic_substring<const_char>::first_of(&local_1f8,'>',0);
      if ((sVar14 != 0xffffffffffffffff) && (local_1f8.len < sVar14)) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
          pcVar1 = (code *)swi(3);
          uVar10 = (*pcVar1)();
          return (bool)uVar10;
        }
        handle_error(0x1e5106,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x1572,"pos <= len || pos == npos");
      }
      if (sVar14 == 0xffffffffffffffff) {
        msg._0_8_ = local_1f8.str;
        msg._8_3_ = (undefined3)local_1f8.len;
        msg._11_3_ = local_1f8.len._3_3_;
        msg._14_2_ = local_1f8.len._6_2_;
      }
      else {
        basic_substring<const_char>::basic_substring
                  ((basic_substring<const_char> *)msg,local_1f8.str,sVar14 + 1);
      }
      local_1e8.len = CONCAT26(msg._14_2_,CONCAT33(msg._11_3_,msg._8_3_));
      local_1e8.str = (char *)msg._0_8_;
      if (local_1e8.len < (char *)0x2) {
        builtin_strncpy(msg + 0x10,".len >= 2)",0xb);
        builtin_strncpy(msg,"check failed: (t",0x10);
        if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
          pcVar1 = (code *)swi(3);
          uVar10 = (*pcVar1)();
          return (bool)uVar10;
        }
        p_Var21 = (this->m_stack).m_callbacks.m_error;
        cVar22 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        pvVar19 = (this->m_stack).m_callbacks.m_user_data;
        local_58 = cVar22.len;
        uStack_70 = 0x7233;
        uStack_60 = cVar22.str._0_4_;
        uStack_5c = cVar22.str._4_4_;
LAB_001c5b41:
        auVar3 = ZEXT424(uStack_70) << 0x40;
        LVar4.name.str._0_4_ = uStack_60;
        LVar4.super_LineCol.offset = auVar3._0_8_;
        LVar4.super_LineCol.line = auVar3._8_8_;
        LVar4.super_LineCol.col = auVar3._16_8_;
        LVar4.name.str._4_4_ = uStack_5c;
        LVar4.name.len = local_58;
        (*p_Var21)(msg,0x1b,LVar4,pvVar19);
      }
    }
    else {
      pattern_01.len = 3;
      pattern_01.str = "!h!";
      bVar9 = basic_substring<const_char>::begins_with(&local_1f8,pattern_01);
      if (bVar9) {
        sVar14 = basic_substring<const_char>::first_of(&local_1f8,' ',0);
        if ((sVar14 != 0xffffffffffffffff) && (local_1f8.len < sVar14)) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
            pcVar1 = (code *)swi(3);
            uVar10 = (*pcVar1)();
            return (bool)uVar10;
          }
          handle_error(0x1e5106,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1569,"pos <= len || pos == npos");
        }
        if (sVar14 == 0xffffffffffffffff) {
          msg._0_8_ = local_1f8.str;
          msg._8_3_ = (undefined3)local_1f8.len;
          msg._11_3_ = local_1f8.len._3_3_;
          msg._14_2_ = local_1f8.len._6_2_;
        }
        else {
          basic_substring<const_char>::basic_substring
                    ((basic_substring<const_char> *)msg,local_1f8.str,sVar14);
        }
        local_1e8.len = CONCAT26(msg._14_2_,CONCAT33(msg._11_3_,msg._8_3_));
        local_1e8.str = (char *)msg._0_8_;
        if (local_1e8.len < (char *)0x3) {
          builtin_strncpy(msg + 0x10,".len >= 3)",0xb);
          builtin_strncpy(msg,"check failed: (t",0x10);
          if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
            pcVar1 = (code *)swi(3);
            uVar10 = (*pcVar1)();
            return (bool)uVar10;
          }
          p_Var21 = (this->m_stack).m_callbacks.m_error;
          cVar22 = to_csubstr(
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                             );
          pvVar19 = (this->m_stack).m_callbacks.m_user_data;
          local_80 = cVar22.len;
          uStack_98 = 0x723a;
          uStack_88 = cVar22.str._0_4_;
          uStack_84 = cVar22.str._4_4_;
          uStack_70 = uStack_98;
          uStack_60 = uStack_88;
          uStack_5c = uStack_84;
          local_58 = local_80;
          goto LAB_001c5b41;
        }
      }
      else if ((local_1f8.len != 0) && (*local_1f8.str == '!')) {
        sVar14 = basic_substring<const_char>::first_of(&local_1f8,' ',0);
        if ((sVar14 != 0xffffffffffffffff) && (local_1f8.len < sVar14)) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
            pcVar1 = (code *)swi(3);
            uVar10 = (*pcVar1)();
            return (bool)uVar10;
          }
          handle_error(0x1e5106,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1569,"pos <= len || pos == npos");
        }
        if (sVar14 == 0xffffffffffffffff) {
          msg._0_8_ = local_1f8.str;
          msg._8_3_ = (undefined3)local_1f8.len;
          msg._11_3_ = local_1f8.len._3_3_;
          msg._14_2_ = local_1f8.len._6_2_;
        }
        else {
          basic_substring<const_char>::basic_substring
                    ((basic_substring<const_char> *)msg,local_1f8.str,sVar14);
        }
        local_1e8.str = (char *)msg._0_8_;
        local_1e8.len = CONCAT26(msg._14_2_,CONCAT33(msg._11_3_,msg._8_3_));
        if ((char *)local_1e8.len == (char *)0x0) {
          builtin_strncpy(msg + 0x10,".len >= 1)",0xb);
          builtin_strncpy(msg,"check failed: (t",0x10);
          if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
            pcVar1 = (code *)swi(3);
            uVar10 = (*pcVar1)();
            return (bool)uVar10;
          }
          p_Var21 = (this->m_stack).m_callbacks.m_error;
          cVar22 = to_csubstr(
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                             );
          pvVar19 = (this->m_stack).m_callbacks.m_user_data;
          local_a8 = cVar22.len;
          uStack_c0 = 0x7241;
          uStack_b0 = cVar22.str._0_4_;
          uStack_ac = cVar22.str._4_4_;
          uStack_70 = uStack_c0;
          uStack_60 = uStack_b0;
          uStack_5c = uStack_ac;
          local_58 = local_a8;
          goto LAB_001c5b41;
        }
      }
    }
  }
  bVar9 = (yml *)local_1e8.str != (yml *)0x0 && (char *)local_1e8.len != (char *)0x0;
  if ((yml *)local_1e8.str == (yml *)0x0 || (char *)local_1e8.len == (char *)0x0) {
    return bVar9;
  }
  pSVar20 = this->m_state;
  if ((~pSVar20->flags & 0x220U) == 0) {
    if ((pSVar20->flags & 0x40U) == 0) {
      builtin_strncpy(msg + 0x10,"as_any(RKEY",0xb);
      builtin_strncpy(msg,"check failed: (h",0x10);
      if ((((byte)s_error_flags & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
        pcVar1 = (code *)swi(3);
        uVar10 = (*pcVar1)();
        return (bool)uVar10;
      }
      p_Var21 = (this->m_stack).m_callbacks.m_error;
      cVar22 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_d0 = cVar22.len;
      auVar3 = ZEXT1224(ZEXT412(0x724a) << 0x40);
      LVar5.name.str._0_4_ = (int)cVar22.str;
      LVar5.super_LineCol.offset = auVar3._0_8_;
      LVar5.super_LineCol.line = auVar3._8_8_;
      LVar5.super_LineCol.col = auVar3._16_8_;
      LVar5.name.str._4_4_ = cVar22.str._4_4_;
      LVar5.name.len = local_d0;
      (*p_Var21)(msg,0x1e,LVar5,(this->m_stack).m_callbacks.m_user_data);
    }
    _append_key_val_null(this,local_1f8.str + -1);
    pSVar20 = this->m_state;
    pSVar20->flags = pSVar20->flags & 0xffffffdf;
  }
  cVar22.len = local_1e8.len;
  cVar22.str = local_1e8.str;
  sVar14 = LineContents::current_col(&pSVar20->line_contents,cVar22);
  pyVar16 = (yml *)(this->m_state->line_contents).rem.str;
  if ((yml *)(local_1e8.str + local_1e8.len) <= pyVar16) {
    builtin_strncpy(msg + 0x10,".end() > m_",0xb);
    builtin_strncpy(msg,"check failed: (t",0x10);
    if ((((byte)s_error_flags & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
      pcVar1 = (code *)swi(3);
      uVar10 = (*pcVar1)();
      return (bool)uVar10;
    }
    p_Var21 = (this->m_stack).m_callbacks.m_error;
    cVar22 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_f8 = cVar22.len;
    auVar3 = ZEXT1224(ZEXT412(0x7255) << 0x40);
    LVar6.name.str._0_4_ = (int)cVar22.str;
    LVar6.super_LineCol.offset = auVar3._0_8_;
    LVar6.super_LineCol.line = auVar3._8_8_;
    LVar6.super_LineCol.col = auVar3._16_8_;
    LVar6.name.str._4_4_ = cVar22.str._4_4_;
    LVar6.name.len = local_f8;
    (*p_Var21)(msg,0x3d,LVar6,(this->m_stack).m_callbacks.m_user_data);
    pyVar16 = (yml *)(this->m_state->line_contents).rem.str;
  }
  _line_progressed(this,(long)(local_1e8.len + (long)local_1e8.str) - (long)pyVar16);
  chars_00.len = 2;
  chars_00.str = " \t";
  sVar15 = basic_substring<const_char>::first_not_of(&(this->m_state->line_contents).rem,chars_00,0)
  ;
  if (sVar15 != 0xffffffffffffffff) {
    _line_progressed(this,sVar15);
  }
  pSVar20 = this->m_state;
  uVar17 = ~pSVar20->flags;
  uVar18 = (ulong)uVar17;
  if ((uVar17 & 0x44) == 0) {
    if (((this->m_key_tag).len != 0) && ((this->m_key_tag).str != (char *)0x0)) {
      builtin_strncpy(msg + 0x10,"_key_tag.em",0xb);
      builtin_strncpy(msg,"check failed: (m",0x10);
      if ((((byte)s_error_flags & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
        pcVar1 = (code *)swi(3);
        uVar10 = (*pcVar1)();
        return (bool)uVar10;
      }
      p_Var21 = (this->m_stack).m_callbacks.m_error;
      cVar22 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_120 = cVar22.len;
      auVar3 = ZEXT1224(ZEXT412(0x7260) << 0x40);
      LVar7.name.str._0_4_ = (int)cVar22.str;
      LVar7.super_LineCol.offset = auVar3._0_8_;
      LVar7.super_LineCol.line = auVar3._8_8_;
      LVar7.super_LineCol.col = auVar3._16_8_;
      LVar7.name.str._4_4_ = cVar22.str._4_4_;
      LVar7.name.len = local_120;
      (*p_Var21)(msg,0x22,LVar7,(this->m_stack).m_callbacks.m_user_data);
      uVar18 = extraout_RDX;
    }
    (this->m_key_tag).str = local_1e8.str;
    (this->m_key_tag).len = local_1e8.len;
  }
  else {
    if ((uVar17 & 0x84) == 0) {
      local_1f8 = (pSVar20->line_contents).rem;
      pattern_02.len = 1;
      pattern_02.str = "#";
      sVar15 = basic_substring<const_char>::find(&local_1f8,pattern_02,0);
      if ((sVar15 != 0xffffffffffffffff) && (local_1f8.len < sVar15)) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
          pcVar1 = (code *)swi(3);
          uVar10 = (*pcVar1)();
          return (bool)uVar10;
        }
        handle_error(0x1e5106,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x1569,"pos <= len || pos == npos");
      }
      if (sVar15 == 0xffffffffffffffff) {
        msg._0_8_ = local_1f8.str;
        msg._8_3_ = (undefined3)local_1f8.len;
        msg._11_3_ = local_1f8.len._3_3_;
        msg._14_2_ = local_1f8.len._6_2_;
      }
      else {
        basic_substring<const_char>::basic_substring
                  ((basic_substring<const_char> *)msg,local_1f8.str,sVar15);
      }
      local_1f8.len._3_1_ = msg[0xb];
      local_1f8.len._4_1_ = msg[0xc];
      local_1f8.len._5_1_ = msg[0xd];
      local_1f8.len._0_1_ = msg[8];
      local_1f8.len._1_1_ = msg[9];
      local_1f8.len._2_1_ = msg[10];
      local_1f8.len._6_1_ = msg[0xe];
      local_1f8.len._7_1_ = msg[0xf];
      local_1f8.str = (char *)msg._0_8_;
      chars_01.len = 2;
      chars_01.str = " \t";
      local_1f8 = basic_substring<const_char>::trimr(&local_1f8,chars_01);
      uVar18 = local_1f8.len;
      if (((this->m_val_tag).len != 0) && ((this->m_val_tag).str != (char *)0x0)) {
        builtin_strncpy(msg + 0x10,"_val_tag.em",0xb);
        builtin_strncpy(msg,"check failed: (m",0x10);
        if ((((byte)s_error_flags & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
          pcVar1 = (code *)swi(3);
          uVar10 = (*pcVar1)();
          return (bool)uVar10;
        }
        p_Var21 = (this->m_stack).m_callbacks.m_error;
        cVar22 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        pvVar19 = (this->m_stack).m_callbacks.m_user_data;
        local_148 = cVar22.len;
        uStack_160 = 0x7279;
        uStack_150 = cVar22.str._0_4_;
        uStack_14c = cVar22.str._4_4_;
LAB_001c6047:
        auVar3 = ZEXT424(uStack_160) << 0x40;
        LVar8.name.str._0_4_ = uStack_150;
        LVar8.super_LineCol.offset = auVar3._0_8_;
        LVar8.super_LineCol.line = auVar3._8_8_;
        LVar8.super_LineCol.col = auVar3._16_8_;
        LVar8.name.str._4_4_ = uStack_14c;
        LVar8.name.len = local_148;
        (*p_Var21)(msg,0x22,LVar8,pvVar19);
        uVar18 = extraout_RDX_01;
      }
LAB_001c605b:
      (this->m_val_tag).str = local_1e8.str;
      (this->m_val_tag).len = local_1e8.len;
LAB_001c6064:
      this->m_val_tag_indentation = sVar14;
      goto LAB_001c606b;
    }
    bVar11 = (uVar17 & 0x1003) != 0;
    uVar18 = (ulong)CONCAT31((int3)(uVar17 >> 8),bVar11);
    if ((uVar17 & 0x88) != 0 && bVar11) {
      if ((pSVar20->flags & 2U) == 0) {
        bVar11 = is_debugger_attached();
        if ((bVar11) && (bVar11 = is_debugger_attached(), bVar11)) {
          pcVar1 = (code *)swi(3);
          uVar10 = (*pcVar1)();
          return (bool)uVar10;
        }
        fmt.len = 0x15;
        fmt.str = "ERROR: internal error";
        _err<>(this,fmt);
        uVar18 = extraout_RDX_00;
        goto LAB_001c606b;
      }
      local_1f8 = (pSVar20->line_contents).rem;
      pattern_03.len = 1;
      pattern_03.str = "#";
      sVar15 = basic_substring<const_char>::find(&local_1f8,pattern_03,0);
      if ((sVar15 != 0xffffffffffffffff) && (local_1f8.len < sVar15)) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
          pcVar1 = (code *)swi(3);
          uVar10 = (*pcVar1)();
          return (bool)uVar10;
        }
        handle_error(0x1e5106,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x1569,"pos <= len || pos == npos");
      }
      if (sVar15 == 0xffffffffffffffff) {
        msg._0_8_ = local_1f8.str;
        msg._8_3_ = (undefined3)local_1f8.len;
        msg._11_3_ = local_1f8.len._3_3_;
        msg._14_2_ = local_1f8.len._6_2_;
      }
      else {
        basic_substring<const_char>::basic_substring
                  ((basic_substring<const_char> *)msg,local_1f8.str,sVar15);
      }
      local_1f8.len._3_1_ = msg[0xb];
      local_1f8.len._4_1_ = msg[0xc];
      local_1f8.len._5_1_ = msg[0xd];
      local_1f8.len._0_1_ = msg[8];
      local_1f8.len._1_1_ = msg[9];
      local_1f8.len._2_1_ = msg[10];
      local_1f8.len._6_1_ = msg[0xe];
      local_1f8.len._7_1_ = msg[0xf];
      local_1f8.str = (char *)msg._0_8_;
      chars_02.len = 2;
      chars_02.str = " \t";
      local_1f8 = basic_substring<const_char>::trimr(&local_1f8,chars_02);
      uVar18 = local_1f8.len;
      if (local_1f8.str == (char *)0x0 || uVar18 == 0) {
        if (((this->m_val_tag).len != 0) && ((this->m_val_tag).str != (char *)0x0)) {
          builtin_strncpy(msg + 0x10,"_val_tag.em",0xb);
          builtin_strncpy(msg,"check failed: (m",0x10);
          if ((((byte)s_error_flags & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
            pcVar1 = (code *)swi(3);
            uVar10 = (*pcVar1)();
            return (bool)uVar10;
          }
          p_Var21 = (this->m_stack).m_callbacks.m_error;
          cVar22 = to_csubstr(
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                             );
          pvVar19 = (this->m_stack).m_callbacks.m_user_data;
          local_170 = cVar22.len;
          uStack_188 = 0x7294;
          uStack_178 = cVar22.str._0_4_;
          uStack_174 = cVar22.str._4_4_;
          uStack_160 = uStack_188;
          uStack_150 = uStack_178;
          uStack_14c = uStack_174;
          local_148 = local_170;
          goto LAB_001c6047;
        }
        goto LAB_001c605b;
      }
      if (((this->m_key_tag).len != 0) && ((this->m_key_tag).str != (char *)0x0)) {
        (this->m_key_tag2).str = local_1e8.str;
        (this->m_key_tag2).len = local_1e8.len;
        this->m_key_tag2_indentation = sVar14;
        goto LAB_001c606b;
      }
      (this->m_key_tag).str = local_1e8.str;
      (this->m_key_tag).len = local_1e8.len;
    }
    else {
      if (((this->m_val_tag).len == 0) || ((this->m_val_tag).str == (char *)0x0)) {
        (this->m_val_tag).str = local_1e8.str;
        (this->m_val_tag).len = local_1e8.len;
        goto LAB_001c6064;
      }
      (this->m_key_tag).str = local_1e8.str;
      (this->m_key_tag).len = local_1e8.len;
    }
  }
  this->m_key_tag_indentation = sVar14;
LAB_001c606b:
  if (((((this->m_val_tag).len != 0) && ((this->m_val_tag).str != (char *)0x0)) &&
      (tag.len = uVar18, tag.str = (char *)local_1e8.len, YVar12 = to_tag((yml *)local_1e8.str,tag),
      YVar12 == TAG_STR)) && ((~this->m_state->flags & 0x1003U) == 0)) {
    cVar22 = _slurp_doc_scalar(this);
    Tree::to_val(this->m_tree,this->m_state->node_id,cVar22,0x10);
    this_00 = this->m_tree;
    sVar14 = this->m_state->node_id;
    cVar22 = normalize_tag(this->m_val_tag);
    Tree::set_val_tag(this_00,sVar14,cVar22);
    (this->m_val_tag).str = (char *)0x0;
    (this->m_val_tag).len = 0;
    if ((this->m_val_anchor).str != (char *)0x0 && (this->m_val_anchor).len != 0) {
      Tree::set_val_anchor(this->m_tree,this->m_state->node_id,this->m_val_anchor);
      (this->m_val_anchor).str = (char *)0x0;
      (this->m_val_anchor).len = 0;
    }
    _end_stream(this);
  }
  return bVar9;
}

Assistant:

bool Parser::_handle_types()
{
    csubstr rem = m_state->line_contents.rem.triml(' ');
    csubstr t;

    if(rem.begins_with("!!"))
    {
        _c4dbgp("begins with '!!'");
        t = rem.left_of(rem.first_of(" ,"));
        _RYML_CB_ASSERT(m_stack.m_callbacks, t.len >= 2);
        //t = t.sub(2);
        if(t == "!!set")
            add_flags(RSET);
    }
    else if(rem.begins_with("!<"))
    {
        _c4dbgp("begins with '!<'");
        t = rem.left_of(rem.first_of('>'), true);
        _RYML_CB_ASSERT(m_stack.m_callbacks, t.len >= 2);
        //t = t.sub(2, t.len-1);
    }
    else if(rem.begins_with("!h!"))
    {
        _c4dbgp("begins with '!h!'");
        t = rem.left_of(rem.first_of(' '));
        _RYML_CB_ASSERT(m_stack.m_callbacks, t.len >= 3);
        //t = t.sub(3);
    }
    else if(rem.begins_with('!'))
    {
        _c4dbgp("begins with '!'");
        t = rem.left_of(rem.first_of(' '));
        _RYML_CB_ASSERT(m_stack.m_callbacks, t.len >= 1);
        //t = t.sub(1);
    }

    if(t.empty())
        return false;

    if(has_all(QMRK|SSCL))
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_any(RKEY));
        _c4dbgp("there is a stored key, so this tag is for the next element");
        _append_key_val_null(rem.str - 1);
        rem_flags(QMRK);
    }

    #ifdef RYML_NO_COVERAGE__TO_BE_DELETED
    const char *tag_beginning = rem.str;
    #endif
    size_t tag_indentation = m_state->line_contents.current_col(t);
    _c4dbgpf("there was a tag: '{}', indentation={}", t, tag_indentation);
    _RYML_CB_ASSERT(m_stack.m_callbacks, t.end() > m_state->line_contents.rem.begin());
    _line_progressed(static_cast<size_t>(t.end() - m_state->line_contents.rem.begin()));
    {
        size_t pos = m_state->line_contents.rem.first_not_of(" \t");
        if(pos != csubstr::npos)
            _line_progressed(pos);
    }

    if(has_all(RMAP|RKEY))
    {
        _c4dbgpf("saving map key tag '{}'", t);
        _RYML_CB_ASSERT(m_stack.m_callbacks, m_key_tag.empty());
        m_key_tag = t;
        m_key_tag_indentation = tag_indentation;
    }
    else if(has_all(RMAP|RVAL))
    {
        /* foo: !!str
         * !!str : bar  */
        rem = m_state->line_contents.rem;
        rem = rem.left_of(rem.find("#"));
        rem = rem.trimr(" \t");
        _c4dbgpf("rem='{}'", rem);
        #ifdef RYML_NO_COVERAGE__TO_BE_DELETED
        if(rem == ':' || rem.begins_with(": "))
        {
            _c4dbgp("the last val was null, and this is a tag from a null key");
            _append_key_val_null(tag_beginning - 1);
            _store_scalar_null(rem.str - 1);
            // do not change the flag to key, it is ~
            _RYML_CB_ASSERT(m_stack.m_callbacks, rem.begin() > m_state->line_contents.rem.begin());
            size_t token_len = rem == ':' ? 1 : 2;
            _line_progressed(static_cast<size_t>(token_len + rem.begin() - m_state->line_contents.rem.begin()));
        }
        #endif
        _c4dbgpf("saving map val tag '{}'", t);
        _RYML_CB_ASSERT(m_stack.m_callbacks, m_val_tag.empty());
        m_val_tag = t;
        m_val_tag_indentation = tag_indentation;
    }
    else if(has_all(RSEQ|RVAL) || has_all(RTOP|RUNK|NDOC))
    {
        if(m_val_tag.empty())
        {
            _c4dbgpf("saving seq/doc val tag '{}'", t);
            m_val_tag = t;
            m_val_tag_indentation = tag_indentation;
        }
        else
        {
            _c4dbgpf("saving seq/doc key tag '{}'", t);
            m_key_tag = t;
            m_key_tag_indentation = tag_indentation;
        }
    }
    else if(has_all(RTOP|RUNK) || has_any(RUNK))
    {
        rem = m_state->line_contents.rem;
        rem = rem.left_of(rem.find("#"));
        rem = rem.trimr(" \t");
        if(rem.empty())
        {
            _c4dbgpf("saving val tag '{}'", t);
            _RYML_CB_ASSERT(m_stack.m_callbacks, m_val_tag.empty());
            m_val_tag = t;
            m_val_tag_indentation = tag_indentation;
        }
        else
        {
            _c4dbgpf("saving key tag '{}'", t);
            if(m_key_tag.empty())
            {
                m_key_tag = t;
                m_key_tag_indentation = tag_indentation;
            }
            else
            {
                /* handle this case:
                 * !!str foo: !!map
                 *   !!int 1: !!float 20.0
                 *   !!int 3: !!float 40.0
                 *
                 * (m_key_tag would be !!str and m_key_tag2 would be !!int)
                 */
                m_key_tag2 = t;
                m_key_tag2_indentation = tag_indentation;
            }
        }
    }
    else
    {
        _c4err("internal error");
    }

    if(m_val_tag.not_empty())
    {
        YamlTag_e tag = to_tag(t);
        if(tag == TAG_STR)
        {
            _c4dbgpf("tag '{}' is a str-type tag", t);
            if(has_all(RTOP|RUNK|NDOC))
            {
                _c4dbgpf("docval. slurping the string. pos={}", m_state->pos.offset);
                csubstr scalar = _slurp_doc_scalar();
                _c4dbgpf("docval. after slurp: {}, at node {}: '{}'", m_state->pos.offset, m_state->node_id, scalar);
                m_tree->to_val(m_state->node_id, scalar, DOC);
                _c4dbgpf("docval. val tag {} -> {}", m_val_tag, normalize_tag(m_val_tag));
                m_tree->set_val_tag(m_state->node_id, normalize_tag(m_val_tag));
                m_val_tag.clear();
                if(!m_val_anchor.empty())
                {
                    _c4dbgpf("setting val anchor[{}]='{}'", m_state->node_id, m_val_anchor);
                    m_tree->set_val_anchor(m_state->node_id, m_val_anchor);
                    m_val_anchor.clear();
                }
                _end_stream();
            }
        }
    }
    return true;
}